

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar_LibCutMarkMffc(Aig_Man_t *p,Aig_Obj_t *pRoot,int nLeaves,float *pPower)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_2c;
  int nNodes;
  int i;
  float *pPower_local;
  int nLeaves_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *p_local;
  
  for (local_2c = 0; local_2c < nLeaves; local_2c = local_2c + 1) {
    pAVar2 = Aig_Regular(s_DarLib->pDatas[local_2c].field_0.pFunc);
    *(ulong *)&pAVar2->field_0x18 =
         *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)&pAVar2->field_0x18 >> 6) & 0x3ffffff) + 1) & 0x3ffffff) << 6;
  }
  iVar1 = Aig_NodeMffcLabel(p,pRoot,pPower);
  for (local_2c = 0; local_2c < nLeaves; local_2c = local_2c + 1) {
    pAVar2 = Aig_Regular(s_DarLib->pDatas[local_2c].field_0.pFunc);
    *(ulong *)&pAVar2->field_0x18 =
         *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)&pAVar2->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
  }
  return iVar1;
}

Assistant:

int Dar_LibCutMarkMffc( Aig_Man_t * p, Aig_Obj_t * pRoot, int nLeaves, float * pPower )
{
    int i, nNodes;
    // mark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs++;
    // label MFFC with current ID
    nNodes = Aig_NodeMffcLabel( p, pRoot, pPower );
    // unmark the cut leaves
    for ( i = 0; i < nLeaves; i++ )
        Aig_Regular(s_DarLib->pDatas[i].pFunc)->nRefs--;
    return nNodes;
}